

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O0

Vec_Int_t * Seg_ManCountIntEdges(Gia_Man_t *p,Vec_Int_t *vPolars,Vec_Int_t *vToSkip,int nFanouts)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Gia_Obj_t *pObj;
  Vec_Int_t *vEdges;
  int iFanin;
  int iLut;
  int i;
  int nFanouts_local;
  Vec_Int_t *vToSkip_local;
  Vec_Int_t *vPolars_local;
  Gia_Man_t *p_local;
  
  p_00 = Vec_IntAlloc(1000);
  iVar1 = Gia_ManHasMapping(p);
  if (iVar1 != 0) {
    Vec_IntClear(vPolars);
    Vec_IntClear(vToSkip);
    if (nFanouts != 0) {
      Gia_ManSetLutRefs(p);
    }
    for (vEdges._4_4_ = 1; iVar1 = Gia_ManObjNum(p), vEdges._4_4_ < iVar1;
        vEdges._4_4_ = vEdges._4_4_ + 1) {
      iVar1 = Gia_ObjIsLut(p,vEdges._4_4_);
      if (iVar1 != 0) {
        for (iFanin = 0; iVar1 = Gia_ObjLutSize(p,vEdges._4_4_), iFanin < iVar1; iFanin = iFanin + 1
            ) {
          piVar3 = Gia_ObjLutFanins(p,vEdges._4_4_);
          iVar1 = piVar3[iFanin];
          pObj = Gia_ManObj(p,iVar1);
          iVar2 = Gia_ObjIsAnd(pObj);
          if (iVar2 != 0) {
            if ((p->vEdge1 != (Vec_Int_t *)0x0) &&
               (iVar2 = Gia_ObjCheckEdge(p,iVar1,vEdges._4_4_), iVar2 != 0)) {
              iVar2 = Vec_IntSize(p_00);
              Vec_IntPush(vPolars,iVar2 / 2);
            }
            if ((nFanouts != 0) && (iVar2 = Gia_ObjLutRefNumId(p,iVar1), nFanouts <= iVar2)) {
              iVar2 = Vec_IntSize(p_00);
              Vec_IntPush(vToSkip,iVar2 / 2);
            }
            Vec_IntPushTwo(p_00,iVar1,vEdges._4_4_);
          }
        }
      }
    }
    if ((nFanouts != 0) && (p->pLutRefs != (int *)0x0)) {
      free(p->pLutRefs);
      p->pLutRefs = (int *)0x0;
    }
    return p_00;
  }
  __assert_fail("Gia_ManHasMapping(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatEdge.c"
                ,0x53,"Vec_Int_t *Seg_ManCountIntEdges(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int)")
  ;
}

Assistant:

Vec_Int_t * Seg_ManCountIntEdges( Gia_Man_t * p, Vec_Int_t * vPolars, Vec_Int_t * vToSkip, int nFanouts )
{
    int i, iLut, iFanin;
    Vec_Int_t * vEdges = Vec_IntAlloc( 1000 );
    assert( Gia_ManHasMapping(p) );
    Vec_IntClear( vPolars );
    Vec_IntClear( vToSkip );
    if ( nFanouts )
        Gia_ManSetLutRefs( p );
    Gia_ManForEachLut( p, iLut )
        Gia_LutForEachFanin( p, iLut, iFanin, i )
            if ( Gia_ObjIsAnd(Gia_ManObj(p, iFanin)) )
            {
                if ( p->vEdge1 && Gia_ObjCheckEdge(p, iFanin, iLut) )
                    Vec_IntPush( vPolars, Vec_IntSize(vEdges)/2 );
                if ( nFanouts && Gia_ObjLutRefNumId(p, iFanin) >= nFanouts )
                    Vec_IntPush( vToSkip, Vec_IntSize(vEdges)/2 );
                Vec_IntPushTwo( vEdges, iFanin, iLut );
            }
    if ( nFanouts )
        ABC_FREE( p->pLutRefs );
    return vEdges;
}